

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

bool absl::cord_internal::CordRepBtree::IsValid(CordRepBtree *tree,bool shallow)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long *plVar4;
  CordRepBtree *tree_00;
  Nonnull<char_*> pcVar5;
  long *plVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint64_t local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long local_90;
  Nonnull<char_*> local_88;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  if (tree == (CordRepBtree *)0x0) {
    pcVar8 = "tree != nullptr";
    iVar7 = 0x1bb;
  }
  else if ((tree->super_CordRep).tag == '\x03') {
    if ((tree->super_CordRep).storage[0] < 0xc) {
      bVar1 = (tree->super_CordRep).storage[1];
      if (bVar1 < 6) {
        bVar2 = (tree->super_CordRep).storage[2];
        if (bVar2 < 7) {
          if (bVar1 <= bVar2) {
            bVar10 = bVar1 == bVar2;
            if (bVar10) {
              local_d8 = 0;
            }
            else {
              lVar9 = (ulong)bVar1 << 3;
              local_d8 = 0;
              do {
                plVar4 = *(long **)((long)tree->edges_ + lVar9);
                if (plVar4 == (long *)0x0) {
                  iVar7 = 0x1c3;
                  pcVar8 = "edge != nullptr";
LAB_0013b3a7:
                  bVar11 = false;
                  raw_log_internal::RawLog
                            (kError,"cord_rep_btree.cc",iVar7,
                             "CordRepBtree::CheckValid() FAILED: %s",pcVar8);
                }
                else {
                  bVar1 = (tree->super_CordRep).storage[0];
                  bVar3 = *(byte *)((long)plVar4 + 0xc);
                  if (bVar1 != 0) {
                    if (bVar3 == 3) {
                      if (bVar1 - 1 == (uint)*(byte *)((long)plVar4 + 0xd)) goto LAB_0013b351;
                      iVar7 = 0x1c6;
                      pcVar8 = "edge->btree()->height() == tree->height() - 1";
                    }
                    else {
                      iVar7 = 0x1c5;
                      pcVar8 = "edge->IsBtree()";
                    }
                    goto LAB_0013b3a7;
                  }
                  if (bVar3 < 5) {
                    plVar6 = plVar4;
                    if (bVar3 == 1) {
                      plVar6 = (long *)plVar4[3];
                    }
                    if (*(byte *)((long)plVar6 + 0xc) < 5) {
                      iVar7 = 0x1c8;
                      pcVar8 = "IsDataEdge(edge)";
                      goto LAB_0013b3a7;
                    }
                  }
LAB_0013b351:
                  local_d8 = local_d8 + *plVar4;
                  bVar11 = true;
                }
                if (!bVar11) break;
                lVar9 = lVar9 + 8;
                bVar10 = (ulong)bVar2 * 8 == lVar9;
              } while (!bVar10);
            }
            if (bVar10) {
              if (local_d8 == (tree->super_CordRep).length) {
                if ((shallow) &&
                   ((_ZN4absl13cord_internal12_GLOBAL__N_132cord_btree_exhaustive_validationE_0 & 1)
                    == 0)) {
                  return true;
                }
                if ((tree->super_CordRep).storage[0] == '\0') {
                  return true;
                }
                bVar1 = (tree->super_CordRep).storage[1];
                bVar2 = (tree->super_CordRep).storage[2];
                if (bVar1 == bVar2) {
                  return true;
                }
                lVar9 = (ulong)bVar1 << 3;
                while( true ) {
                  tree_00 = *(CordRepBtree **)((long)tree->edges_ + lVar9);
                  if ((tree_00->super_CordRep).tag != '\x03') {
                    __assert_fail("IsBtree()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                                  ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
                  }
                  bVar10 = IsValid(tree_00,shallow);
                  if (!bVar10) break;
                  bVar11 = (ulong)bVar2 * 8 + -8 == lVar9;
                  lVar9 = lVar9 + 8;
                  if (bVar11) {
                    return bVar10;
                  }
                }
                return bVar10;
              }
              pcVar5 = numbers_internal::FastIntToBuffer(local_d8,local_50);
              local_60 = (long)pcVar5 - (long)local_50;
              local_d0[0] = local_c0;
              local_58 = local_50;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,local_50,pcVar5);
              plVar4 = local_d0[0];
              pcVar5 = numbers_internal::FastIntToBuffer((tree->super_CordRep).length,local_80);
              local_90 = (long)pcVar5 - (long)local_80;
              local_b0[0] = local_a0;
              local_88 = local_80;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,local_80,pcVar5);
              raw_log_internal::RawLog
                        (kError,"cord_rep_btree.cc",0x1cc,
                         "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)","child_length",
                         "tree->length",plVar4,local_b0[0]);
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (local_d0[0] != local_c0) {
                operator_delete(local_d0[0],local_c0[0] + 1);
              }
            }
            return false;
          }
          pcVar8 = "tree->begin() <= tree->end()";
          iVar7 = 0x1c0;
        }
        else {
          pcVar8 = "tree->end() <= tree->capacity()";
          iVar7 = 0x1bf;
        }
      }
      else {
        pcVar8 = "tree->begin() < tree->capacity()";
        iVar7 = 0x1be;
      }
    }
    else {
      pcVar8 = "tree->height() <= kMaxHeight";
      iVar7 = 0x1bd;
    }
  }
  else {
    pcVar8 = "tree->IsBtree()";
    iVar7 = 0x1bc;
  }
  raw_log_internal::RawLog
            (kError,"cord_rep_btree.cc",iVar7,"CordRepBtree::CheckValid() FAILED: %s",pcVar8);
  return false;
}

Assistant:

bool CordRepBtree::IsValid(const CordRepBtree* tree, bool shallow) {
#define NODE_CHECK_VALID(x)                                           \
  if (!(x)) {                                                         \
    ABSL_RAW_LOG(ERROR, "CordRepBtree::CheckValid() FAILED: %s", #x); \
    return false;                                                     \
  }
#define NODE_CHECK_EQ(x, y)                                                    \
  if ((x) != (y)) {                                                            \
    ABSL_RAW_LOG(ERROR,                                                        \
                 "CordRepBtree::CheckValid() FAILED: %s != %s (%s vs %s)", #x, \
                 #y, absl::StrCat(x).c_str(), absl::StrCat(y).c_str());        \
    return false;                                                              \
  }

  NODE_CHECK_VALID(tree != nullptr);
  NODE_CHECK_VALID(tree->IsBtree());
  NODE_CHECK_VALID(tree->height() <= kMaxHeight);
  NODE_CHECK_VALID(tree->begin() < tree->capacity());
  NODE_CHECK_VALID(tree->end() <= tree->capacity());
  NODE_CHECK_VALID(tree->begin() <= tree->end());
  size_t child_length = 0;
  for (CordRep* edge : tree->Edges()) {
    NODE_CHECK_VALID(edge != nullptr);
    if (tree->height() > 0) {
      NODE_CHECK_VALID(edge->IsBtree());
      NODE_CHECK_VALID(edge->btree()->height() == tree->height() - 1);
    } else {
      NODE_CHECK_VALID(IsDataEdge(edge));
    }
    child_length += edge->length;
  }
  NODE_CHECK_EQ(child_length, tree->length);
  if ((!shallow || IsCordBtreeExhaustiveValidationEnabled()) &&
      tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!IsValid(edge->btree(), shallow)) return false;
    }
  }
  return true;

#undef NODE_CHECK_VALID
#undef NODE_CHECK_EQ
}